

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cc
# Opt level: O1

void __thiscall
absl::lts_20240722::flags_internal::FlagRegistry::RegisterFlag
          (FlagRegistry *this,CommandLineFlag *flag,char *filename)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  pointer prVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  char **args;
  char (*in_stack_fffffffffffffd58) [179];
  string local_2a0;
  FlagRegistry *local_280;
  size_t local_278;
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  basic_string_view<char,_std::char_traits<char>_> local_250 [2];
  undefined1 local_230 [32];
  undefined1 local_210 [48];
  char *filename_local;
  basic_string_view<char,_std::char_traits<char>_> local_1d8;
  undefined1 local_1c8 [16];
  char local_1b8 [8];
  char *local_1b0;
  char *local_1a8;
  FlagRegistry *local_1a0;
  undefined8 local_198;
  char *local_190;
  long *local_188;
  size_t local_180;
  long local_178 [2];
  AlphaNum local_168;
  AlphaNum local_138;
  long *local_108;
  size_t local_100;
  long local_f8 [2];
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>::iterator,_bool>
  ins;
  undefined1 local_d0 [160];
  
  filename_local = filename;
  if (filename == (char *)0x0) {
LAB_00106c74:
    bVar8 = false;
LAB_00106c76:
    if (filename != (char *)0x0) {
      if (local_108 != local_f8) {
        operator_delete(local_108,local_f8[0] + 1);
      }
      FlagsUsageConfig::~FlagsUsageConfig((FlagsUsageConfig *)local_d0);
      if (local_188 != local_178) {
        operator_delete(local_188,local_178[0] + 1);
      }
    }
    if (bVar8) {
      local_1d8._M_len = 0x3d;
      local_1d8._M_str = "Inconsistency between flag object and registration for flag \'";
      local_260 = (*(code *)**(undefined8 **)flag)(flag);
      local_210._0_8_ = (FlagRegistry *)0x46;
      local_210._8_8_ = "\', likely due to duplicate flags or an ODR violation. Relevant files: ";
      args = (char **)0x106e0d;
      (**(code **)(*(long *)flag + 8))(&local_280,flag);
      local_138.piece_._M_len = local_278;
      local_138.piece_._M_str = (char *)local_280;
      local_168.piece_._M_len = 5;
      local_168.piece_._M_str = " and ";
      StrCat<char_const*>(&local_2a0,(lts_20240722 *)&local_1d8,(AlphaNum *)local_260,
                          (AlphaNum *)local_210,&local_138,&local_168,(AlphaNum *)&filename_local,
                          args);
      absl::lts_20240722::flags_internal::ReportUsageError
                (local_2a0._M_string_length,local_2a0._M_dataplus._M_p,1);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_280);
      goto LAB_00106e8a;
    }
    absl::lts_20240722::Mutex::Lock();
    local_1d8 = (basic_string_view<char,_std::char_traits<char>_>)
                (*(code *)**(undefined8 **)flag)(flag);
    local_260._0_8_ = &local_1d8;
    local_260._8_8_ = local_1c8;
    local_210._0_8_ = this;
    local_1c8._0_8_ = flag;
    container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20240722::CommandLineFlag*>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,absl::lts_20240722::CommandLineFlag*>>>
    ::EmplaceDecomposable::operator()
              (&ins,local_210,(basic_string_view<char,_std::char_traits<char>_> *)local_260._0_8_,
               (piecewise_construct_t *)&std::piecewise_construct,
               (tuple<const_std::basic_string_view<char,_std::char_traits<char>_>_&&> *)local_260,
               (tuple<absl::lts_20240722::CommandLineFlag_*&&> *)(local_260 + 8));
    if (ins.second != false) {
LAB_00106d98:
      absl::lts_20240722::Mutex::Unlock();
      return;
    }
    prVar5 = container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>
             ::iterator::operator->(&ins.first);
    this = (FlagRegistry *)prVar5->second;
    cVar2 = (**(code **)(*(long *)flag + 0x18))(flag);
    cVar3 = (**(code **)(*(long *)&(this->flags_).
                                   super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>
                                   .
                                   super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>
                                   .settings_.
                                   super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                   .
                                   super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                                   .value + 0x18))(this);
    if (cVar2 != cVar3) goto LAB_00106e99;
    lVar6 = absl::lts_20240722::flags_internal::PrivateHandleAccessor::TypeId(flag);
    lVar7 = absl::lts_20240722::flags_internal::PrivateHandleAccessor::TypeId
                      ((CommandLineFlag *)this);
    if (lVar6 == lVar7) {
      cVar2 = (**(code **)(*(long *)&(this->flags_).
                                     super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>
                                     .
                                     super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>
                                     .settings_.
                                     super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                     .
                                     super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                                     .value + 0x18))(this);
      if (cVar2 != '\0') goto LAB_00106d98;
      (**(code **)(*(long *)&(this->flags_).
                             super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>
                             .
                             super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>
                             .settings_.
                             super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                             .
                             super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                             .value + 8))(&local_1d8,this);
      (**(code **)(*(long *)flag + 8))(local_260,flag);
      bVar8 = true;
      if (local_1d8._M_str == (char *)local_260._8_8_) {
        if (local_1d8._M_str == (char *)0x0) {
          bVar8 = false;
        }
        else {
          iVar4 = bcmp((void *)local_1d8._M_len,(void *)local_260._0_8_,(size_t)local_1d8._M_str);
          bVar8 = iVar4 != 0;
        }
      }
      if ((basic_string_view<char,_std::char_traits<char>_> *)local_260._0_8_ != local_250) {
        operator_delete((void *)local_260._0_8_,local_250[0]._M_len + 1);
      }
      if ((undefined1 *)local_1d8._M_len != local_1c8) {
        operator_delete((void *)local_1d8._M_len,(ulong)(local_1c8._0_8_ + 1));
      }
      if (bVar8) {
        local_1d8._M_len = 6;
        local_1d8._M_str = "Flag \'";
        local_260 = (*(code *)**(undefined8 **)flag)(flag);
        local_210._0_8_ = (FlagRegistry *)0x28;
        local_210._8_8_ = "\' was defined more than once (in files \'";
        (**(code **)(*(long *)&(this->flags_).
                               super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>
                               .
                               super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>
                               .settings_.
                               super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                               .
                               super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                               .value + 8))(&local_280,this);
        local_138.piece_._M_len = local_278;
        local_138.piece_._M_str = (char *)local_280;
        local_168.piece_._M_len = 7;
        local_168.piece_._M_str = "\' and \'";
        (**(code **)(*(long *)flag + 8))((AlphaNum *)local_230,flag);
        StrCat<std::__cxx11::string,char[4]>
                  (&local_2a0,(lts_20240722 *)&local_1d8,(AlphaNum *)local_260,(AlphaNum *)local_210
                   ,&local_138,&local_168,(AlphaNum *)local_230,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\').",
                   (char (*) [4])in_stack_fffffffffffffd58);
        absl::lts_20240722::flags_internal::ReportUsageError
                  (local_2a0._M_string_length,local_2a0._M_dataplus._M_p,1);
      }
      else {
        local_1d8._M_len = 0x1e;
        local_1d8._M_str = "Something is wrong with flag \'";
        local_260 = (*(code *)**(undefined8 **)flag)(flag);
        local_210._0_8_ = (FlagRegistry *)0xb;
        local_210._8_8_ = "\' in file \'";
        (**(code **)(*(long *)flag + 8))(&local_280,flag);
        local_138.piece_._M_len = local_278;
        local_138.piece_._M_str = (char *)local_280;
        local_168.piece_._M_len = 0x1a;
        local_168.piece_._M_str = "\'. One possibility: file \'";
        (**(code **)(*(long *)flag + 8))((AlphaNum *)local_230,flag);
        StrCat<std::__cxx11::string,char[179]>
                  (&local_2a0,(lts_20240722 *)&local_1d8,(AlphaNum *)local_260,(AlphaNum *)local_210
                   ,&local_138,&local_168,(AlphaNum *)local_230,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\' is being linked both statically and dynamically into this executable. e.g. some files listed as srcs to a test and also listed as srcs of some shared lib deps of the same test."
                   ,in_stack_fffffffffffffd58);
        absl::lts_20240722::flags_internal::ReportUsageError
                  (local_2a0._M_string_length,local_2a0._M_dataplus._M_p,1);
      }
    }
    else {
      local_1d8._M_len = 6;
      local_1d8._M_str = "Flag \'";
      local_260 = (*(code *)**(undefined8 **)flag)(flag);
      local_210._0_8_ = (FlagRegistry *)0x49;
      local_210._8_8_ =
           "\' was defined more than once but with differing types. Defined in files \'";
      (**(code **)(*(long *)&(this->flags_).
                             super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>
                             .
                             super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>
                             .settings_.
                             super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                             .
                             super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                             .value + 8))(&local_280,this);
      local_138.piece_._M_len = local_278;
      local_138.piece_._M_str = (char *)local_280;
      local_168.piece_._M_len = 7;
      local_168.piece_._M_str = "\' and \'";
      (**(code **)(*(long *)flag + 8))((AlphaNum *)local_230,flag);
      StrCat<std::__cxx11::string,char[3]>
                (&local_2a0,(lts_20240722 *)&local_1d8,(AlphaNum *)local_260,(AlphaNum *)local_210,
                 &local_138,&local_168,(AlphaNum *)local_230,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\'.",
                 (char (*) [3])in_stack_fffffffffffffd58);
      absl::lts_20240722::flags_internal::ReportUsageError
                (local_2a0._M_string_length,local_2a0._M_dataplus._M_p,1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if (local_230._0_8_ != (long)local_230 + 0x10) {
      operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
    }
    local_210._16_8_ = local_270._0_8_;
    if (local_280 == (FlagRegistry *)local_270) goto LAB_00106e8a;
  }
  else {
    (**(code **)(*(long *)flag + 8))(&local_188,flag);
    absl::lts_20240722::flags_internal::GetUsageConfig();
    pcVar1 = filename_local;
    local_1d8._M_len = strlen(filename_local);
    local_1d8._M_str = pcVar1;
    if (local_d0._144_8_ != 0) {
      (*(code *)local_d0._152_8_)(&local_108,local_d0 + 0x80,&local_1d8);
      bVar8 = true;
      if (local_180 == local_100) {
        if (local_180 == 0) goto LAB_00106c74;
        iVar4 = bcmp(local_188,local_108,local_180);
        bVar8 = iVar4 != 0;
      }
      goto LAB_00106c76;
    }
    std::__throw_bad_function_call();
LAB_00106e99:
    auVar9 = (*(code *)**(undefined8 **)flag)(flag);
    cVar2 = (**(code **)(*(long *)flag + 0x18))(flag);
    if (cVar2 != '\0') {
      flag = (CommandLineFlag *)this;
    }
    (**(code **)(*(long *)&(((FlagRegistry *)flag)->flags_).
                           super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>
                           .
                           super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>
                           .settings_.
                           super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                           .
                           super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                           .value + 8))(local_210,flag);
    local_1d8._M_len = 0xe;
    local_1d8._M_str = "Retired flag \'";
    local_1b8[0] = ' ';
    local_1b8[1] = '\0';
    local_1b8[2] = '\0';
    local_1b8[3] = '\0';
    local_1b8[4] = '\0';
    local_1b8[5] = '\0';
    local_1b8[6] = '\0';
    local_1b8[7] = '\0';
    local_1b0 = "\' was defined normally in file \'";
    local_1a8 = (char *)local_210._8_8_;
    local_1a0 = (FlagRegistry *)local_210._0_8_;
    local_198 = 2;
    local_190 = "\'.";
    local_1c8 = auVar9;
    absl::lts_20240722::strings_internal::CatPieces_abi_cxx11_(local_260,&local_1d8,5);
    absl::lts_20240722::flags_internal::ReportUsageError(local_260._8_8_,local_260._0_8_,1);
    if ((basic_string_view<char,_std::char_traits<char>_> *)local_260._0_8_ != local_250) {
      operator_delete((void *)local_260._0_8_,local_250[0]._M_len + 1);
    }
    local_280 = (FlagRegistry *)local_210._0_8_;
    if ((FlagRegistry *)local_210._0_8_ == (FlagRegistry *)(local_210 + 0x10)) goto LAB_00106e8a;
  }
  operator_delete(local_280,local_210._16_8_ + 1);
LAB_00106e8a:
  exit(1);
}

Assistant:

void FlagRegistry::RegisterFlag(CommandLineFlag& flag, const char* filename) {
  if (filename != nullptr &&
      flag.Filename() != GetUsageConfig().normalize_filename(filename)) {
    flags_internal::ReportUsageError(
        absl::StrCat(
            "Inconsistency between flag object and registration for flag '",
            flag.Name(),
            "', likely due to duplicate flags or an ODR violation. Relevant "
            "files: ",
            flag.Filename(), " and ", filename),
        true);
    std::exit(1);
  }

  FlagRegistryLock registry_lock(*this);

  std::pair<FlagIterator, bool> ins =
      flags_.insert(FlagMap::value_type(flag.Name(), &flag));
  if (ins.second == false) {  // means the name was already in the map
    CommandLineFlag& old_flag = *ins.first->second;
    if (flag.IsRetired() != old_flag.IsRetired()) {
      // All registrations must agree on the 'retired' flag.
      flags_internal::ReportUsageError(
          absl::StrCat(
              "Retired flag '", flag.Name(), "' was defined normally in file '",
              (flag.IsRetired() ? old_flag.Filename() : flag.Filename()), "'."),
          true);
    } else if (flags_internal::PrivateHandleAccessor::TypeId(flag) !=
               flags_internal::PrivateHandleAccessor::TypeId(old_flag)) {
      flags_internal::ReportUsageError(
          absl::StrCat("Flag '", flag.Name(),
                       "' was defined more than once but with "
                       "differing types. Defined in files '",
                       old_flag.Filename(), "' and '", flag.Filename(), "'."),
          true);
    } else if (old_flag.IsRetired()) {
      return;
    } else if (old_flag.Filename() != flag.Filename()) {
      flags_internal::ReportUsageError(
          absl::StrCat("Flag '", flag.Name(),
                       "' was defined more than once (in files '",
                       old_flag.Filename(), "' and '", flag.Filename(), "')."),
          true);
    } else {
      flags_internal::ReportUsageError(
          absl::StrCat(
              "Something is wrong with flag '", flag.Name(), "' in file '",
              flag.Filename(), "'. One possibility: file '", flag.Filename(),
              "' is being linked both statically and dynamically into this "
              "executable. e.g. some files listed as srcs to a test and also "
              "listed as srcs of some shared lib deps of the same test."),
          true);
    }
    // All cases above are fatal, except for the retired flags.
    std::exit(1);
  }
}